

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

int iswapw(int val)

{
  anon_union_2_2_f9eca7f1 endiancheck;
  int val_local;
  
  return val;
}

Assistant:

static int iswapw(int val)
{
	union
	{
		short sv;
		char cv[2];
	} endiancheck;
	/* A smart compiler will optimize this check away. */
	endiancheck.sv = 1;
	if (endiancheck.cv[0] == 1)
	{
		return val;
	}
	endiancheck.sv = val;
	return (unsigned char)endiancheck.cv[0] | (endiancheck.cv[1] << 8);
}